

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

unsigned_long * bn_expand_internal(BIGNUM *b,int words)

{
  int iVar1;
  int in_ESI;
  BIGNUM *in_RDI;
  unsigned_long *a;
  int in_stack_ffffffffffffffdc;
  char *file;
  undefined4 in_stack_ffffffffffffffe8;
  unsigned_long *local_8;
  
  file = (char *)0x0;
  if (in_ESI < 0x800000) {
    iVar1 = BN_get_flags(in_RDI,2);
    if (iVar1 == 0) {
      iVar1 = BN_get_flags(in_RDI,8);
      if (iVar1 == 0) {
        local_8 = (unsigned_long *)
                  CRYPTO_zalloc((size_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                (int)((ulong)file >> 0x20));
      }
      else {
        local_8 = (unsigned_long *)
                  CRYPTO_secure_zalloc
                            (CONCAT44(in_ESI,in_stack_ffffffffffffffe8),file,
                             in_stack_ffffffffffffffdc);
      }
      if (local_8 == (unsigned_long *)0x0) {
        ERR_new();
        ERR_set_debug((char *)in_RDI,in_ESI,(char *)local_8);
        ERR_set_error(3,0xc0100,(char *)0x0);
        local_8 = (unsigned_long *)0x0;
      }
      else if (0 < in_RDI->top) {
        memcpy(local_8,in_RDI->d,(long)in_RDI->top << 3);
      }
    }
    else {
      ERR_new();
      ERR_set_debug((char *)in_RDI,in_ESI,file);
      ERR_set_error(3,0x69,(char *)0x0);
      local_8 = (unsigned_long *)0x0;
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)in_RDI,in_ESI,file);
    ERR_set_error(3,0x72,(char *)0x0);
    local_8 = (unsigned_long *)0x0;
  }
  return local_8;
}

Assistant:

static BN_ULONG *bn_expand_internal(const BIGNUM *b, int words)
{
    BN_ULONG *a = NULL;

    if (words > (INT_MAX / (4 * BN_BITS2))) {
        ERR_raise(ERR_LIB_BN, BN_R_BIGNUM_TOO_LONG);
        return NULL;
    }
    if (BN_get_flags(b, BN_FLG_STATIC_DATA)) {
        ERR_raise(ERR_LIB_BN, BN_R_EXPAND_ON_STATIC_BIGNUM_DATA);
        return NULL;
    }
    if (BN_get_flags(b, BN_FLG_SECURE))
        a = OPENSSL_secure_zalloc(words * sizeof(*a));
    else
        a = OPENSSL_zalloc(words * sizeof(*a));
    if (a == NULL) {
        ERR_raise(ERR_LIB_BN, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    assert(b->top <= words);
    if (b->top > 0)
        memcpy(a, b->d, sizeof(*a) * b->top);

    return a;
}